

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> __thiscall
llvm::DWARFContext::create
          (DWARFContext *this,
          StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
          *Sections,uint8_t AddrSize,bool isLittleEndian)

{
  undefined1 local_28 [8];
  __single_object DObj;
  bool isLittleEndian_local;
  uint8_t AddrSize_local;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  *Sections_local;
  
  DObj._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl._6_1_ =
       isLittleEndian;
  DObj._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl._7_1_ =
       AddrSize;
  std::
  make_unique<(anonymous_namespace)::DWARFObjInMemory,llvm::StringMap<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>,llvm::MallocAllocator>const&,unsigned_char&,bool&>
            ((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_28,(uchar *)Sections,
             (bool *)((long)&DObj._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                             ._M_head_impl + 7));
  std::
  make_unique<llvm::DWARFContext,std::unique_ptr<(anonymous_namespace)::DWARFObjInMemory,std::default_delete<(anonymous_namespace)::DWARFObjInMemory>>,char_const(&)[1]>
            ((unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
              *)this,(char (*) [1])local_28);
  std::
  unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 *)local_28);
  return (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
         (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<DWARFContext>
DWARFContext::create(const StringMap<std::unique_ptr<MemoryBuffer>> &Sections,
                     uint8_t AddrSize, bool isLittleEndian) {
  auto DObj =
      std::make_unique<DWARFObjInMemory>(Sections, AddrSize, isLittleEndian);
  return std::make_unique<DWARFContext>(std::move(DObj), "");
}